

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O3

bool __thiscall
sptk::HuffmanCoding::Run
          (HuffmanCoding *this,vector<double,_std::allocator<double>_> *probabilities,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *codewords)

{
  pointer pbVar1;
  Node *pNVar2;
  Node *pNVar3;
  pointer ppNVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  size_type __new_size;
  double dVar8;
  priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
  tree;
  priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
  local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if (codewords !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __new_size = (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3;
      iVar5 = this->num_element_;
      if (__new_size == (long)iVar5) {
        if ((long)(codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(codewords,__new_size);
          iVar5 = this->num_element_;
        }
        if (iVar5 == 1) {
          pbVar1 = (codewords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::_M_replace
                    ((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x10c460);
          bVar6 = true;
        }
        else {
          local_78.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (0 < iVar5) {
            lVar7 = 0;
            local_38 = codewords;
            do {
              local_58._M_dataplus._M_p = (pointer)operator_new(0x28);
              dVar8 = (probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
              *(undefined ***)local_58._M_dataplus._M_p = &PTR__Node_00110cc0;
              *(int *)(local_58._M_dataplus._M_p + 8) = (int)lVar7;
              *(double *)(local_58._M_dataplus._M_p + 0x10) = dVar8;
              local_58._M_dataplus._M_p[0x18] = '\0';
              local_58._M_dataplus._M_p[0x19] = '\0';
              local_58._M_dataplus._M_p[0x1a] = '\0';
              local_58._M_dataplus._M_p[0x1b] = '\0';
              local_58._M_dataplus._M_p[0x1c] = '\0';
              local_58._M_dataplus._M_p[0x1d] = '\0';
              local_58._M_dataplus._M_p[0x1e] = '\0';
              local_58._M_dataplus._M_p[0x1f] = '\0';
              local_58._M_dataplus._M_p[0x20] = '\0';
              local_58._M_dataplus._M_p[0x21] = '\0';
              local_58._M_dataplus._M_p[0x22] = '\0';
              local_58._M_dataplus._M_p[0x23] = '\0';
              local_58._M_dataplus._M_p[0x24] = '\0';
              local_58._M_dataplus._M_p[0x25] = '\0';
              local_58._M_dataplus._M_p[0x26] = '\0';
              local_58._M_dataplus._M_p[0x27] = '\0';
              std::
              priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
              ::push(&local_78,(value_type *)&local_58);
              lVar7 = lVar7 + 1;
              codewords = local_38;
            } while (lVar7 < this->num_element_);
          }
          if (8 < (ulong)((long)local_78.c.
                                super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_78.c.
                               super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            do {
              pNVar2 = *local_78.c.
                        super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              std::
              priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
              ::pop(&local_78);
              pNVar3 = *local_78.c.
                        super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              std::
              priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
              ::pop(&local_78);
              local_58._M_dataplus._M_p = (pointer)operator_new(0x28);
              *(undefined ***)local_58._M_dataplus._M_p = &PTR__Node_00110cc0;
              local_58._M_dataplus._M_p[8] = -1;
              local_58._M_dataplus._M_p[9] = -1;
              local_58._M_dataplus._M_p[10] = -1;
              local_58._M_dataplus._M_p[0xb] = -1;
              dVar8 = 0.0;
              if (pNVar3 != (Node *)0x0 && pNVar2 != (Node *)0x0) {
                dVar8 = pNVar2->probability_ + pNVar3->probability_;
              }
              *(double *)(local_58._M_dataplus._M_p + 0x10) = dVar8;
              *(Node **)(local_58._M_dataplus._M_p + 0x18) = pNVar2;
              *(Node **)(local_58._M_dataplus._M_p + 0x20) = pNVar3;
              std::
              priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
              ::push(&local_78,(value_type *)&local_58);
            } while (8 < (ulong)((long)local_78.c.
                                       super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.c.
                                      super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
          }
          ppNVar4 = local_78.c.
                    super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar2 = *local_78.c.
                    super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
          anon_unknown.dwarf_d900::Encode(pNVar2,&local_58,codewords);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          bVar6 = true;
          anon_unknown.dwarf_d900::Free(*ppNVar4);
          operator_delete(ppNVar4);
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool HuffmanCoding::Run(const std::vector<double>& probabilities,
                        std::vector<std::string>* codewords) const {
  // Check inputs.
  if (!is_valid_ ||
      probabilities.size() != static_cast<std::size_t>(num_element_) ||
      NULL == codewords) {
    return false;
  }

  // Prepare memories.
  if (codewords->size() != static_cast<std::size_t>(num_element_)) {
    codewords->resize(num_element_);
  }

  if (1 == num_element_) {
    (*codewords)[0] = "0";
    return true;
  }

  std::priority_queue<Node*, std::vector<Node*>, Compare> tree;

  try {
    for (int i(0); i < num_element_; ++i) {
      tree.push(new Node(i, probabilities[i]));
    }
    while (1 < tree.size()) {
      const Node* left(tree.top());
      tree.pop();
      const Node* right(tree.top());
      tree.pop();

      try {
        tree.push(new Node(left, right));
      } catch (...) {
        delete left;
        delete right;
        throw;
      }
    }
    Encode(tree.top(), "", codewords);
    Free(tree.top());
  } catch (...) {
    while (!tree.empty()) {
      Free(tree.top());
      tree.pop();
    }
    return false;
  }

  return true;
}